

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt * __thiscall llvm::APInt::operator+=(APInt *this,APInt *RHS)

{
  WordType *dst;
  WordType *rhs;
  bool bVar1;
  uint parts;
  APInt *pAVar2;
  APInt *RHS_local;
  APInt *this_local;
  
  if (this->BitWidth != RHS->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0xc1,"APInt &llvm::APInt::operator+=(const APInt &)");
  }
  bVar1 = isSingleWord(this);
  if (bVar1) {
    (this->U).pVal = (uint64_t *)((long)(RHS->U).pVal + (long)(this->U).pVal);
  }
  else {
    dst = (this->U).pVal;
    rhs = (RHS->U).pVal;
    parts = getNumWords(this);
    tcAdd(dst,rhs,0,parts);
  }
  pAVar2 = clearUnusedBits(this);
  return pAVar2;
}

Assistant:

APInt& APInt::operator+=(const APInt& RHS) {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  if (isSingleWord())
    U.VAL += RHS.U.VAL;
  else
    tcAdd(U.pVal, RHS.U.pVal, 0, getNumWords());
  return clearUnusedBits();
}